

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

void parse_diagnostics(options_i *options,vw *all)

{
  bool bVar1;
  int iVar2;
  option_group_definition *poVar3;
  long lVar4;
  ostream *poVar5;
  float fVar6;
  double dVar7;
  bool version_arg;
  bool help;
  string progress_arg;
  option_group_definition diagnostic_group;
  bool local_56f;
  bool local_56e;
  allocator local_56d;
  allocator local_56c;
  allocator local_56b;
  allocator local_56a;
  allocator local_569;
  allocator local_568;
  allocator local_567;
  allocator local_566;
  allocator local_565;
  allocator local_564;
  allocator local_563;
  allocator local_562;
  allocator local_561;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  string local_540 [32];
  string local_520 [32];
  string local_500;
  string local_4e0 [32];
  string local_4c0;
  string local_4a0 [32];
  string local_480 [32];
  string local_460;
  string local_440 [32];
  string local_420 [32];
  string local_400;
  string local_3e0 [32];
  string local_3c0;
  string local_3a0;
  undefined1 local_380 [160];
  option_group_definition local_2e0;
  undefined1 local_2a8 [80];
  string local_258 [80];
  undefined1 local_208 [80];
  string local_1b8 [80];
  undefined1 local_168 [80];
  string local_118 [80];
  undefined1 local_c8 [160];
  
  local_56f = false;
  local_56e = false;
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  local_560._M_string_length = 0;
  local_560.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_3a0,"Diagnostic options",(allocator *)local_380);
  VW::config::option_group_definition::option_group_definition(&local_2e0,&local_3a0);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::string((string *)&local_3c0,"version",&local_561);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_380,&local_3c0,&local_56f);
  std::__cxx11::string::string(local_3e0,"Version information",&local_562);
  std::__cxx11::string::_M_assign((string *)(local_380 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_2e0,(typed_option<bool> *)local_380);
  std::__cxx11::string::string((string *)&local_400,"audit",&local_563);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2a8,&local_400,&all->audit);
  std::__cxx11::string::string(local_420,"a",&local_564);
  std::__cxx11::string::_M_assign(local_258);
  std::__cxx11::string::string(local_440,"print weights of features",&local_565);
  std::__cxx11::string::_M_assign((string *)(local_2a8 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar3,(typed_option<bool> *)local_2a8);
  std::__cxx11::string::string((string *)&local_460,"progress",&local_566);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_168,&local_460,&local_560);
  std::__cxx11::string::string(local_480,"P",&local_567);
  std::__cxx11::string::_M_assign(local_118);
  std::__cxx11::string::string
            (local_4a0,"Progress update frequency. int: additive, float: multiplicative",&local_568)
  ;
  std::__cxx11::string::_M_assign((string *)(local_168 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar3,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_168);
  std::__cxx11::string::string((string *)&local_4c0,"quiet",&local_569);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_c8,&local_4c0,&all->quiet);
  std::__cxx11::string::string
            (local_4e0,"Don\'t output disgnostics and progress updates",&local_56a);
  std::__cxx11::string::_M_assign((string *)(local_c8 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar3,(typed_option<bool> *)local_c8);
  std::__cxx11::string::string((string *)&local_500,"help",&local_56b);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_208,&local_500,&local_56e);
  std::__cxx11::string::string(local_520,"h",&local_56c);
  std::__cxx11::string::_M_assign(local_1b8);
  std::__cxx11::string::string
            (local_540,"Look here: http://hunch.net/~vw/ and click on Tutorial.",&local_56d);
  std::__cxx11::string::_M_assign((string *)(local_208 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar3,(typed_option<bool> *)local_208);
  std::__cxx11::string::~string(local_540);
  std::__cxx11::string::~string(local_520);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_208);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string(local_4e0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_c8);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::__cxx11::string::~string(local_4a0);
  std::__cxx11::string::~string(local_480);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_168);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string(local_440);
  std::__cxx11::string::~string(local_420);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_2a8);
  std::__cxx11::string::~string((string *)&local_400);
  std::__cxx11::string::~string(local_3e0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_380);
  std::__cxx11::string::~string((string *)&local_3c0);
  (**options->_vptr_options_i)(options,&local_2e0);
  if (local_56f != true) {
    std::__cxx11::string::string((string *)local_380,"progress",(allocator *)local_2a8);
    iVar2 = (*options->_vptr_options_i[1])(options,local_380);
    if ((char)iVar2 == '\0') {
      std::__cxx11::string::~string((string *)local_380);
    }
    else {
      bVar1 = all->quiet;
      std::__cxx11::string::~string((string *)local_380);
      if (bVar1 == false) {
        dVar7 = atof(local_560._M_dataplus._M_p);
        all->progress_arg = (float)dVar7;
        lVar4 = std::__cxx11::string::find_first_of((char *)&local_560,0x23ec40);
        if (lVar4 == -1) {
          all->progress_add = true;
          fVar6 = all->progress_arg;
          if (fVar6 < 1.0) {
            poVar5 = std::operator<<(&(all->trace_message).super_ostream,
                                     "warning: additive --progress <int>");
            poVar5 = std::operator<<(poVar5," can\'t be < 1: forcing to 1");
            std::endl<char,std::char_traits<char>>(poVar5);
            all->progress_arg = 1.0;
            fVar6 = 1.0;
          }
          all->sd->dump_interval = fVar6;
        }
        else {
          all->progress_add = false;
          if (all->progress_arg <= 1.0) {
            poVar5 = std::operator<<(&(all->trace_message).super_ostream,
                                     "warning: multiplicative --progress <float>: ");
            poVar5 = std::operator<<(poVar5,(string *)&local_560);
            poVar5 = std::operator<<(poVar5," is <= 1.0: adding 1.0");
            std::endl<char,std::char_traits<char>>(poVar5);
            all->progress_arg = all->progress_arg + 1.0;
          }
          else if (9.0 < all->progress_arg) {
            poVar5 = std::operator<<(&(all->trace_message).super_ostream,
                                     "warning: multiplicative --progress <float>");
            poVar5 = std::operator<<(poVar5," is > 9.0: you probably meant to use an integer");
            std::endl<char,std::char_traits<char>>(poVar5);
          }
          all->sd->dump_interval = 1.0;
        }
      }
    }
    VW::config::option_group_definition::~option_group_definition(&local_2e0);
    std::__cxx11::string::~string((string *)&local_560);
    return;
  }
  version_struct::to_string_abi_cxx11_((string *)local_380,&version);
  poVar5 = std::operator<<((ostream *)&std::cout,(string *)local_380);
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string((string *)local_380);
  exit(0);
}

Assistant:

void parse_diagnostics(options_i& options, vw& all)
{
  bool version_arg = false;
  bool help = false;
  std::string progress_arg;
  option_group_definition diagnostic_group("Diagnostic options");
  diagnostic_group.add(make_option("version", version_arg).help("Version information"))
      .add(make_option("audit", all.audit).short_name("a").help("print weights of features"))
      .add(make_option("progress", progress_arg)
               .short_name("P")
               .help("Progress update frequency. int: additive, float: multiplicative"))
      .add(make_option("quiet", all.quiet).help("Don't output disgnostics and progress updates"))
      .add(make_option("help", help).short_name("h").help("Look here: http://hunch.net/~vw/ and click on Tutorial."));

  options.add_and_parse(diagnostic_group);

  // Upon direct query for version -- spit it out to stdout
  if (version_arg)
  {
    cout << version.to_string() << "\n";
    exit(0);
  }

  if (options.was_supplied("progress") && !all.quiet)
  {
    all.progress_arg = (float)::atof(progress_arg.c_str());
    // --progress interval is dual: either integer or floating-point
    if (progress_arg.find_first_of(".") == string::npos)
    {
      // No "." in arg: assume integer -> additive
      all.progress_add = true;
      if (all.progress_arg < 1)
      {
        all.trace_message << "warning: additive --progress <int>"
                          << " can't be < 1: forcing to 1" << endl;
        all.progress_arg = 1;
      }
      all.sd->dump_interval = all.progress_arg;
    }
    else
    {
      // A "." in arg: assume floating-point -> multiplicative
      all.progress_add = false;

      if (all.progress_arg <= 1.0)
      {
        all.trace_message << "warning: multiplicative --progress <float>: " << progress_arg << " is <= 1.0: adding 1.0"
                          << endl;
        all.progress_arg += 1.0;
      }
      else if (all.progress_arg > 9.0)
      {
        all.trace_message << "warning: multiplicative --progress <float>"
                          << " is > 9.0: you probably meant to use an integer" << endl;
      }
      all.sd->dump_interval = 1.0;
    }
  }
}